

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void __thiscall DScroller::Destroy(DScroller *this)

{
  bool bVar1;
  DInterpolation *this_00;
  int local_14;
  int i;
  DScroller *this_local;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    bVar1 = TObjPtr<DInterpolation>::operator!=
                      (this->m_Interpolations + local_14,(DInterpolation *)0x0);
    if (bVar1) {
      this_00 = TObjPtr<DInterpolation>::operator->(this->m_Interpolations + local_14);
      DInterpolation::DelRef(this_00,false);
      TObjPtr<DInterpolation>::operator=(this->m_Interpolations + local_14,(DInterpolation *)0x0);
    }
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DScroller::Destroy ()
{
	for(int i=0;i<3;i++)
	{
		if (m_Interpolations[i] != NULL)
		{
			m_Interpolations[i]->DelRef();
			m_Interpolations[i] = NULL;
		}
	}
	Super::Destroy();
}